

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O3

uintb JumpBasic::backup2Switch(Funcdata *fd,uintb output,Varnode *outvn,Varnode *invn)

{
  PcodeOp *pPVar1;
  TypeOp *pTVar2;
  Varnode *pVVar3;
  AddrSpace *spc;
  OpBehavior *pOVar4;
  uintb uVar5;
  undefined4 extraout_var;
  pointer ppVVar6;
  undefined4 extraout_var_00;
  LowlevelError *this;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  MemoryImage mem;
  undefined1 local_50 [32];
  
  if (outvn != invn) {
    do {
      pPVar1 = outvn->def;
      ppVVar6 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar9 = (ulong)((long)(pPVar1->inrefs).
                            super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppVVar6) >> 3;
      uVar10 = 0;
      uVar7 = (uint)uVar9;
      if (0 < (int)uVar7) {
        uVar10 = 0;
        do {
          if ((ppVVar6[uVar10]->flags & 2) == 0) goto LAB_00281e76;
          uVar10 = uVar10 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar10);
        uVar10 = uVar9 & 0xffffffff;
      }
LAB_00281e76:
      pTVar2 = pPVar1->opcode;
      uVar7 = pPVar1->flags & 0x38000;
      if (uVar7 == 0x8000) {
        pOVar4 = pTVar2->behave;
        iVar8 = (*pOVar4->_vptr_OpBehavior[5])
                          (pOVar4,(ulong)(uint)pPVar1->output->size,output,
                           (ulong)(uint)ppVVar6[uVar10 & 0xffffffff]->size);
        output = CONCAT44(extraout_var,iVar8);
      }
      else {
        if (uVar7 != 0x10000) {
          this = (LowlevelError *)__cxa_allocate_exception(0x20);
          local_50._0_8_ = local_50 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,"Bad switch normalization op","");
          LowlevelError::LowlevelError(this,(string *)local_50);
          __cxa_throw(this,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
        iVar8 = 1 - (int)uVar10;
        pVVar3 = ppVVar6[iVar8];
        spc = (pVVar3->loc).base;
        if (spc->type == IPTR_CONSTANT) {
          uVar5 = (pVVar3->loc).offset;
        }
        else {
          MemoryImage::MemoryImage((MemoryImage *)local_50,spc,4,0x400,fd->glb->loader);
          uVar5 = MemoryBank::getValue
                            ((MemoryBank *)local_50,(pVVar3->loc).offset,
                             (pPVar1->inrefs).
                             super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar8]->size);
          ppVVar6 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        pOVar4 = pTVar2->behave;
        iVar8 = (*pOVar4->_vptr_OpBehavior[4])
                          (pOVar4,uVar10 & 0xffffffff,(ulong)(uint)pPVar1->output->size,output,
                           (ulong)(uint)ppVVar6[uVar10 & 0xffffffff]->size,uVar5);
        output = CONCAT44(extraout_var_00,iVar8);
      }
      outvn = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10 & 0xffffffff];
    } while (outvn != invn);
  }
  return output;
}

Assistant:

uintb JumpBasic::backup2Switch(Funcdata *fd,uintb output,Varnode *outvn,Varnode *invn)

{ // Back up constant normalized value -outvn- to unnormalized
  Varnode *curvn = outvn;
  PcodeOp *op;
  TypeOp *top;
  int4 slot;

  while(curvn != invn) {
    op = curvn->getDef();
    top = op->getOpcode();
    for(slot=0;slot<op->numInput();++slot) // Find first non-constant input
      if (!op->getIn(slot)->isConstant()) break;
    if (op->getEvalType() == PcodeOp::binary) {
      const Address &addr(op->getIn(1-slot)->getAddr());
      uintb otherval;
      if (!addr.isConstant()) {
	MemoryImage mem(addr.getSpace(),4,1024,fd->getArch()->loader);
	otherval = mem.getValue(addr.getOffset(),op->getIn(1-slot)->getSize());
      }
      else
	otherval = addr.getOffset();
      output = top->recoverInputBinary(slot,op->getOut()->getSize(),output,
				       op->getIn(slot)->getSize(),otherval);
      curvn = op->getIn(slot);
    }
    else if (op->getEvalType() == PcodeOp::unary) {
      output = top->recoverInputUnary(op->getOut()->getSize(),output,op->getIn(slot)->getSize());
      curvn = op->getIn(slot);
    }
    else
      throw LowlevelError("Bad switch normalization op");
  }
  return output;
}